

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O0

int ndn_forwarder_add_route_by_str(ndn_face_intf_t *face,char *prefix,size_t length)

{
  int iVar1;
  undefined1 local_1f0 [8];
  ndn_encoder_t encoder;
  ndn_name_t name_prefix;
  size_t length_local;
  char *prefix_local;
  ndn_face_intf_t *face_local;
  
  ndn_name_from_string((ndn_name_t *)&encoder.offset,prefix,(uint32_t)length);
  encoder_init((ndn_encoder_t *)local_1f0,encoding_buf,0x800);
  ndn_name_tlv_encode((ndn_encoder_t *)local_1f0,(ndn_name_t *)&encoder.offset);
  iVar1 = ndn_forwarder_add_route(face,(uint8_t *)local_1f0,(ulong)encoder.output_value._4_4_);
  return iVar1;
}

Assistant:

int
ndn_forwarder_add_route_by_str(ndn_face_intf_t* face, const char* prefix, size_t length)
{
  ndn_name_t name_prefix;
  ndn_name_from_string(&name_prefix, prefix, length);
  ndn_encoder_t encoder;
  encoder_init(&encoder, encoding_buf, sizeof(encoding_buf));
  ndn_name_tlv_encode(&encoder, &name_prefix);
  return ndn_forwarder_add_route(face, encoder.output_value, encoder.offset);
}